

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Codec.h
# Opt level: O1

ssize_t __thiscall
sznet::net::LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_>::send
          (LengthHeaderCodec<std::shared_ptr<sznet::net::TcpConnection>_> *this,int __fd,void *__buf
          ,size_t __n,int __flags)

{
  uint uVar1;
  void *__src;
  pointer __n_00;
  ssize_t sVar2;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  pointer len;
  undefined1 local_68 [8];
  Buffer buf;
  
  Buffer::Buffer((Buffer *)local_68,4,0x400);
  __src = *__buf;
  len = (pointer)(long)*(int *)((long)__buf + 8);
  Buffer::ensureWritableBytes((Buffer *)local_68,(size_t)len);
  memcpy((void *)(buf.m_nCheapPrepend + buf.m_readerIndex),__src,(size_t)len);
  __n_00 = buf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  if (buf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start + (-buf.m_nCheapPrepend - buf.m_readerIndex) < len) {
    __assert_fail("len <= writableBytes()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                  ,0xd4,"void sznet::net::Buffer::hasWritten(size_t)");
  }
  buf.m_readerIndex = (size_t)(len + buf.m_readerIndex);
  if ((pointer)0x3 <
      buf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    uVar1 = *(uint *)((long)__buf + 8);
    *(uint *)(buf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage + (buf.m_nCheapPrepend - 4)) = uVar1;
    buf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         buf.m_buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage + -4;
    sVar2 = TcpConnection::send((TcpConnection *)CONCAT44(in_register_00000034,__fd),(int)local_68,
                                (void *)(ulong)uVar1,(size_t)__n_00,__flags);
    if (buf.m_nCheapPrepend != 0) {
      operator_delete((void *)buf.m_nCheapPrepend);
      sVar2 = extraout_RAX;
    }
    return sVar2;
  }
  __assert_fail("len <= prependableBytes()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/Buffer.h"
                ,0x149,"void sznet::net::Buffer::prepend(const void *, size_t)");
}

Assistant:

void send(TPTR* conn, const StringPiece& message)
	{
		Buffer buf;
		buf.append(message.data(), message.size());
		int32_t len = static_cast<int32_t>(message.size());
		buf.prepend(&len, sizeof(len));
		conn->send(&buf);
	}